

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safequeue.h
# Opt level: O0

bool __thiscall SafeQueueWithNotification<int>::push(SafeQueueWithNotification<int> *this,int *val)

{
  bool bVar1;
  lock_guard<std::mutex> local_28;
  lock_guard<std::mutex> lk;
  int *val_local;
  SafeQueueWithNotification<int> *this_local;
  
  lk._M_device = (mutex_type *)val;
  std::lock_guard<std::mutex>::lock_guard(&local_28,this->m_mtx);
  bVar1 = SafeQueue<int>::push(&this->super_SafeQueue<int>,(int *)lk._M_device);
  if (bVar1) {
    std::condition_variable::notify_one();
  }
  std::lock_guard<std::mutex>::~lock_guard(&local_28);
  return bVar1;
}

Assistant:

bool push(const T& val) override
    {
        std::lock_guard lk(m_mtx);

        if (!SafeQueue<T>::push(val))
            return false;

        m_cond.notify_one();

        return true;
    }